

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_xonly_pubkey_tweak_check(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  int iVar4;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  uchar tweak [32];
  int pk_parity;
  uchar buf32 [32];
  uchar output_pk32 [32];
  secp256k1_xonly_pubkey output_xonly_pk;
  secp256k1_pubkey output_pk;
  secp256k1_xonly_pubkey internal_xonly_pk;
  secp256k1_pubkey internal_pk;
  uchar sk [32];
  uchar overflows [32];
  uchar zeros64 [64];
  _func_void_char_ptr_void_ptr *in_stack_fffffffffffffdb8;
  secp256k1_context *in_stack_fffffffffffffdc0;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe18;
  secp256k1_pubkey *in_stack_fffffffffffffe20;
  secp256k1_context *in_stack_fffffffffffffe28;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe30;
  secp256k1_context *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe48;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  uchar *in_stack_fffffffffffffe60;
  secp256k1_context *in_stack_fffffffffffffe68;
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  memset(local_48,0,0x40);
  memset(local_68,0xff,0x20);
  testrand256((uchar *)in_stack_fffffffffffffdc0);
  testrand256((uchar *)in_stack_fffffffffffffdc0);
  iVar4 = secp256k1_ec_pubkey_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (secp256k1_pubkey *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xd6,"test condition failed: secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1");
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     (int *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xd7,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_tweak_add
                    (in_stack_fffffffffffffe38,(secp256k1_pubkey *)in_stack_fffffffffffffe30,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20->data);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xd9,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     (int *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xda,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_serialize
                    (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20->data,
                     in_stack_fffffffffffffe18);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xdb,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &output_xonly_pk) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xdc,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xdd,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar4 == 1) {
    p_Var1 = (CTX->illegal_callback).fn;
    pvVar2 = (CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(void *)0x15d6ea);
    iVar4 = secp256k1_xonly_pubkey_tweak_add_check
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                       ,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    psVar3 = CTX;
    if (iVar4 == 0) {
      (CTX->illegal_callback).fn = p_Var1;
      (psVar3->illegal_callback).data = pvVar2;
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
              ,0xdf,"test condition failed: _calls_to_callback == 1");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0xdf,
            "test condition failed: (secp256k1_xonly_pubkey_tweak_add_check(CTX, ((void*)0), pk_parity, &internal_xonly_pk, tweak)) == 0"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/tests_impl.h"
          ,0xde,
          "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
         );
  abort();
}

Assistant:

static void test_xonly_pubkey_tweak_check(void) {
    unsigned char zeros64[64] = { 0 };
    unsigned char overflows[32];
    unsigned char sk[32];
    secp256k1_pubkey internal_pk;
    secp256k1_xonly_pubkey internal_xonly_pk;
    secp256k1_pubkey output_pk;
    secp256k1_xonly_pubkey output_xonly_pk;
    unsigned char output_pk32[32];
    unsigned char buf32[32];
    int pk_parity;
    unsigned char tweak[32];

    memset(overflows, 0xff, sizeof(overflows));
    testrand256(tweak);
    testrand256(sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1);

    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &output_xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_tweak_add_check(CTX, NULL, pk_parity, &internal_xonly_pk, tweak));
    /* invalid pk_parity value */
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, 2, &internal_xonly_pk, tweak) == 0);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, NULL, tweak));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, NULL));

    memset(tweak, 1, sizeof(tweak));
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, NULL, &internal_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, output_pk32, &output_xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, tweak) == 1);

    /* Wrong pk_parity */
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, !pk_parity, &internal_xonly_pk, tweak) == 0);
    /* Wrong public key */
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &internal_xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 0);

    /* Overflowing tweak not allowed */
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, overflows) == 0);
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0);
    CHECK(secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0);
}